

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

void __thiscall fasttext::ProductQuantizer::train(ProductQuantizer *this,int32_t n,real *x)

{
  uint uVar1;
  real *x_00;
  pointer piVar2;
  real *c;
  invalid_argument *this_00;
  int iVar3;
  int j;
  ulong uVar4;
  int m;
  uint n_00;
  long lVar5;
  vector<int,_std::allocator<int>_> perm;
  vector<float,_std::allocator<float>_> xslice;
  string local_50;
  
  if (this->ksub_ <= n) {
    xslice.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&perm,(long)n,(value_type_conflict1 *)&xslice,(allocator_type *)&local_50);
    iVar3 = 0;
    for (piVar2 = perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start;
        piVar2 != perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_finish; piVar2 = piVar2 + 1) {
      *piVar2 = iVar3;
      iVar3 = iVar3 + 1;
    }
    uVar1 = this->max_points_;
    iVar3 = this->dsub_;
    n_00 = n;
    if ((int)uVar1 < n) {
      n_00 = uVar1;
    }
    std::vector<float,_std::allocator<float>_>::vector
              (&xslice,(long)(int)(n_00 * iVar3),(allocator_type *)&local_50);
    m = 0;
    while( true ) {
      if (this->nsubq_ <= m) break;
      if (m == this->nsubq_ + -1) {
        iVar3 = this->lastdsub_;
      }
      if ((int)uVar1 < n) {
        std::
        shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>&>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&this->rng);
      }
      lVar5 = 0;
      for (uVar4 = 0;
          x_00 = (real *)CONCAT44(xslice.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  xslice.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_),
          (~((int)n_00 >> 0x1f) & n_00) != uVar4; uVar4 = uVar4 + 1) {
        memcpy(x_00 + lVar5,
               x + (long)this->dim_ *
                   (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar4] + (long)this->dsub_ * (long)m,
               (long)iVar3 * 4);
        lVar5 = lVar5 + iVar3;
      }
      c = get_centroids(this,m,'\0');
      kmeans(this,x_00,c,n_00,iVar3);
      m = m + 1;
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&xslice.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&perm.super__Vector_base<int,_std::allocator<int>_>);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_50,this->ksub_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xslice,
                 "Matrix too small for quantization, must have at least ",&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&perm,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xslice,
                 " rows");
  std::invalid_argument::invalid_argument(this_00,(string *)&perm);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void ProductQuantizer::train(int32_t n, const real* x) {
  if (n < ksub_) {
    throw std::invalid_argument(
        "Matrix too small for quantization, must have at least " +
        std::to_string(ksub_) + " rows");
  }
  std::vector<int32_t> perm(n, 0);
  std::iota(perm.begin(), perm.end(), 0);
  auto d = dsub_;
  auto np = std::min(n, max_points_);
  auto xslice = std::vector<real>(np * dsub_);
  for (auto m = 0; m < nsubq_; m++) {
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    if (np != n) {
      std::shuffle(perm.begin(), perm.end(), rng);
    }
    for (auto j = 0; j < np; j++) {
      memcpy(
          xslice.data() + j * d,
          x + perm[j] * dim_ + m * dsub_,
          d * sizeof(real));
    }
    kmeans(xslice.data(), get_centroids(m, 0), np, d);
  }
}